

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int divsufsort(uchar *T,int *SA,int n,int openMP)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *bucket_A;
  int *bucket_B;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  uint *puVar10;
  char *__assertion;
  uint uVar11;
  int in_R9D;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  iVar5 = -1;
  if (-1 < n && (SA != (int *)0x0 && T != (uchar *)0x0)) {
    if (n == 0) {
      iVar5 = 0;
    }
    else {
      if (n == 2) {
        bVar2 = *T;
        bVar1 = T[1];
        SA[bVar2 >= bVar1] = 0;
        SA[bVar2 < bVar1] = 1;
      }
      else {
        if (n != 1) {
          bucket_A = (int *)malloc(0x400);
          bucket_B = (int *)malloc(0x40000);
          iVar5 = -2;
          if (bucket_B != (int *)0x0 && bucket_A != (int *)0x0) {
            iVar5 = sort_typeBstar(T,SA,bucket_A,bucket_B,n,in_R9D);
            if (0 < iVar5) {
              uVar6 = 0xfe;
              do {
                uVar7 = (int)uVar6 << 8;
                iVar5 = bucket_B[(int)((int)uVar6 + 1U | uVar7)];
                puVar8 = (uint *)(SA + (long)bucket_A[uVar6 + 1] + -1);
                if (SA + iVar5 <= puVar8) {
                  uVar11 = 0xffffffff;
                  puVar10 = (uint *)0x0;
                  do {
                    uVar3 = *puVar8;
                    uVar13 = (ulong)uVar3;
                    if ((int)uVar3 < 1) {
                      if ((uVar13 == 0) && (uVar6 != *T)) {
                        __assert_fail("((s == 0) && (T[s] == c1)) || (s < 0)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbb27,
                                      "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                     );
                      }
                      *puVar8 = ~uVar3;
                    }
                    else {
                      bVar2 = T[uVar13];
                      if (uVar6 != bVar2) {
                        __assert_fail("T[s] == c1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbb1a,
                                      "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                     );
                      }
                      if ((n <= (int)(uVar13 + 1)) || (T[uVar13 + 1] < bVar2)) {
                        __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbb1b,
                                      "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                     );
                      }
                      if (bVar2 < T[uVar13 - 1]) {
                        __assert_fail("T[s - 1] <= T[s]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbb1c,
                                      "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                     );
                      }
                      *puVar8 = ~uVar3;
                      bVar2 = T[uVar3 - 1];
                      uVar14 = (ulong)bVar2;
                      uVar9 = 0;
                      if ((uVar13 != 1) && (uVar9 = uVar3 - 1, bVar2 < T[uVar13 - 2])) {
                        uVar9 = -uVar3;
                      }
                      if (uVar11 == bVar2) {
                        uVar14 = (ulong)uVar11;
                      }
                      else {
                        if (-1 < (int)uVar11) {
                          bucket_B[(int)(uVar11 | uVar7)] =
                               (int)((ulong)((long)puVar10 - (long)SA) >> 2);
                        }
                        puVar10 = (uint *)(SA + bucket_B[(long)(int)uVar7 | uVar14]);
                      }
                      if (puVar8 <= puVar10) {
                        __assertion = "k < j";
LAB_00186e83:
                        __assert_fail(__assertion,
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbb24,
                                      "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                     );
                      }
                      if (puVar10 == (uint *)0x0) {
                        __assertion = "k != NULL";
                        goto LAB_00186e83;
                      }
                      *puVar10 = uVar9;
                      puVar10 = puVar10 + -1;
                      uVar11 = (uint)uVar14;
                    }
                    puVar8 = puVar8 + -1;
                  } while (SA + iVar5 <= puVar8);
                }
                bVar15 = uVar6 != 0;
                uVar6 = uVar6 - 1;
              } while (bVar15);
            }
            uVar6 = (ulong)T[n - 1U];
            uVar7 = -n;
            if (T[n - 1U] <= T[(ulong)(uint)n - 2]) {
              uVar7 = n - 1U;
            }
            iVar4 = bucket_A[uVar6];
            SA[iVar4] = uVar7;
            iVar5 = 0;
            if (n != 0) {
              puVar8 = (uint *)(SA + (long)iVar4 + 1);
              puVar10 = (uint *)SA;
              do {
                uVar7 = *puVar10;
                lVar12 = (long)(int)uVar7;
                if (lVar12 < 1) {
                  if (-1 < (int)uVar7) {
                    __assert_fail("s < 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb3f,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  *puVar10 = ~uVar7;
                }
                else {
                  if (T[lVar12 + -1] < T[lVar12]) {
                    __assert_fail("T[s - 1] >= T[s]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb35,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  uVar11 = uVar7 - 1;
                  bVar2 = T[uVar11];
                  if ((uVar11 == 0) || (T[lVar12 + -2] < bVar2)) {
                    uVar11 = -uVar7;
                  }
                  if ((uint)uVar6 != (uint)bVar2) {
                    bucket_A[uVar6] = (int)((ulong)((long)puVar8 - (long)SA) >> 2);
                    puVar8 = (uint *)(SA + bucket_A[(uint)bVar2]);
                    uVar6 = (ulong)bVar2;
                  }
                  if (puVar8 <= puVar10) {
                    __assert_fail("i < k",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb3c,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  *puVar8 = uVar11;
                  puVar8 = puVar8 + 1;
                }
                puVar10 = puVar10 + 1;
              } while (puVar10 < SA + (uint)n);
            }
          }
          free(bucket_B);
          free(bucket_A);
          return iVar5;
        }
        *SA = 0;
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int
divsufsort(const unsigned char *T, int *SA, int n, int openMP) {
  int *bucket_A, *bucket_B;
  int m;
  int err = 0;

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) { return -1; }
  else if(n == 0) { return 0; }
  else if(n == 1) { SA[0] = 0; return 0; }
  else if(n == 2) { m = (T[0] < T[1]); SA[m ^ 1] = 0, SA[m] = 1; return 0; }

  bucket_A = (int *)malloc(BUCKET_A_SIZE * sizeof(int));
  bucket_B = (int *)malloc(BUCKET_B_SIZE * sizeof(int));

  /* Suffixsort. */
  if((bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, SA, bucket_A, bucket_B, n, openMP);
    construct_SA(T, SA, bucket_A, bucket_B, n, m);
  } else {
    err = -2;
  }

  free(bucket_B);
  free(bucket_A);

  return err;
}